

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# column_data_consumer.cpp
# Opt level: O0

void __thiscall duckdb::ColumnDataConsumer::InitializeScan(ColumnDataConsumer *this)

{
  bool bVar1;
  idx_t iVar2;
  pointer pCVar3;
  ChunkReference *pCVar4;
  __normal_iterator<duckdb::ColumnDataConsumer::ChunkReference_*,_std::vector<duckdb::ColumnDataConsumer::ChunkReference,_std::allocator<duckdb::ColumnDataConsumer::ChunkReference>_>_>
  in_RDI;
  idx_t chunk_index;
  unique_ptr<duckdb::ColumnDataCollectionSegment,_std::default_delete<duckdb::ColumnDataCollectionSegment>,_true>
  *segment;
  const_iterator __end1;
  const_iterator __begin1;
  vector<duckdb::unique_ptr<duckdb::ColumnDataCollectionSegment,_std::default_delete<duckdb::ColumnDataCollectionSegment>,_true>,_true>
  *__range1;
  vector<duckdb::ColumnDataConsumer::ChunkReference,_std::allocator<duckdb::ColumnDataConsumer::ChunkReference>_>
  *in_stack_ffffffffffffff98;
  ChunkReference *in_stack_ffffffffffffffa0;
  __normal_iterator<duckdb::ColumnDataConsumer::ChunkReference_*,_std::vector<duckdb::ColumnDataConsumer::ChunkReference,_std::allocator<duckdb::ColumnDataConsumer::ChunkReference>_>_>
  in_stack_ffffffffffffffa8;
  ColumnDataCollection *in_stack_ffffffffffffffc0;
  size_type in_stack_ffffffffffffffc8;
  vector<duckdb::ColumnDataConsumer::ChunkReference,_std::allocator<duckdb::ColumnDataConsumer::ChunkReference>_>
  *in_stack_ffffffffffffffd0;
  ChunkReference *pCVar5;
  __normal_iterator<const_duckdb::unique_ptr<duckdb::ColumnDataCollectionSegment,_std::default_delete<duckdb::ColumnDataCollectionSegment>,_true>_*,_std::vector<duckdb::unique_ptr<duckdb::ColumnDataCollectionSegment,_std::default_delete<duckdb::ColumnDataCollectionSegment>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnDataCollectionSegment,_std::default_delete<duckdb::ColumnDataCollectionSegment>,_true>_>_>_>
  local_18;
  vector<duckdb::unique_ptr<duckdb::ColumnDataCollectionSegment,_std::default_delete<duckdb::ColumnDataCollectionSegment>,_true>,_true>
  *local_10;
  
  iVar2 = ColumnDataCollection::ChunkCount(in_stack_ffffffffffffffc0);
  *(idx_t *)&in_RDI._M_current[4].chunk_index_in_segment = iVar2;
  *(pointer *)&in_RDI._M_current[6].chunk_index_in_segment = (pointer)0x0;
  *(undefined8 *)&in_RDI._M_current[10].chunk_index_in_segment = 0xffffffffffffffff;
  ::std::
  vector<duckdb::ColumnDataConsumer::ChunkReference,_std::allocator<duckdb::ColumnDataConsumer::ChunkReference>_>
  ::reserve(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  local_10 = ColumnDataCollection::GetSegments
                       (*(ColumnDataCollection **)&in_RDI._M_current[2].chunk_index_in_segment);
  local_18._M_current =
       (unique_ptr<duckdb::ColumnDataCollectionSegment,_std::default_delete<duckdb::ColumnDataCollectionSegment>,_true>
        *)::std::
          vector<duckdb::unique_ptr<duckdb::ColumnDataCollectionSegment,_std::default_delete<duckdb::ColumnDataCollectionSegment>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnDataCollectionSegment,_std::default_delete<duckdb::ColumnDataCollectionSegment>,_true>_>_>
          ::begin((vector<duckdb::unique_ptr<duckdb::ColumnDataCollectionSegment,_std::default_delete<duckdb::ColumnDataCollectionSegment>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnDataCollectionSegment,_std::default_delete<duckdb::ColumnDataCollectionSegment>,_true>_>_>
                   *)in_stack_ffffffffffffff98);
  ::std::
  vector<duckdb::unique_ptr<duckdb::ColumnDataCollectionSegment,_std::default_delete<duckdb::ColumnDataCollectionSegment>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnDataCollectionSegment,_std::default_delete<duckdb::ColumnDataCollectionSegment>,_true>_>_>
  ::end((vector<duckdb::unique_ptr<duckdb::ColumnDataCollectionSegment,_std::default_delete<duckdb::ColumnDataCollectionSegment>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnDataCollectionSegment,_std::default_delete<duckdb::ColumnDataCollectionSegment>,_true>_>_>
         *)in_stack_ffffffffffffff98);
  while( true ) {
    bVar1 = __gnu_cxx::
            operator!=<const_duckdb::unique_ptr<duckdb::ColumnDataCollectionSegment,_std::default_delete<duckdb::ColumnDataCollectionSegment>,_true>_*,_std::vector<duckdb::unique_ptr<duckdb::ColumnDataCollectionSegment,_std::default_delete<duckdb::ColumnDataCollectionSegment>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnDataCollectionSegment,_std::default_delete<duckdb::ColumnDataCollectionSegment>,_true>_>_>_>
                      ((__normal_iterator<const_duckdb::unique_ptr<duckdb::ColumnDataCollectionSegment,_std::default_delete<duckdb::ColumnDataCollectionSegment>,_true>_*,_std::vector<duckdb::unique_ptr<duckdb::ColumnDataCollectionSegment,_std::default_delete<duckdb::ColumnDataCollectionSegment>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnDataCollectionSegment,_std::default_delete<duckdb::ColumnDataCollectionSegment>,_true>_>_>_>
                        *)in_stack_ffffffffffffffa0,
                       (__normal_iterator<const_duckdb::unique_ptr<duckdb::ColumnDataCollectionSegment,_std::default_delete<duckdb::ColumnDataCollectionSegment>,_true>_*,_std::vector<duckdb::unique_ptr<duckdb::ColumnDataCollectionSegment,_std::default_delete<duckdb::ColumnDataCollectionSegment>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnDataCollectionSegment,_std::default_delete<duckdb::ColumnDataCollectionSegment>,_true>_>_>_>
                        *)in_stack_ffffffffffffff98);
    if (!bVar1) break;
    __gnu_cxx::
    __normal_iterator<const_duckdb::unique_ptr<duckdb::ColumnDataCollectionSegment,_std::default_delete<duckdb::ColumnDataCollectionSegment>,_true>_*,_std::vector<duckdb::unique_ptr<duckdb::ColumnDataCollectionSegment,_std::default_delete<duckdb::ColumnDataCollectionSegment>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnDataCollectionSegment,_std::default_delete<duckdb::ColumnDataCollectionSegment>,_true>_>_>_>
    ::operator*(&local_18);
    in_stack_ffffffffffffffa8._M_current = (ChunkReference *)0x0;
    while( true ) {
      pCVar5 = in_stack_ffffffffffffffa8._M_current;
      pCVar3 = unique_ptr<duckdb::ColumnDataCollectionSegment,_std::default_delete<duckdb::ColumnDataCollectionSegment>,_true>
               ::operator->((unique_ptr<duckdb::ColumnDataCollectionSegment,_std::default_delete<duckdb::ColumnDataCollectionSegment>,_true>
                             *)in_stack_ffffffffffffffa0);
      pCVar4 = (ChunkReference *)
               ::std::vector<duckdb::ChunkMetaData,_std::allocator<duckdb::ChunkMetaData>_>::size
                         (&(pCVar3->chunk_data).
                           super_vector<duckdb::ChunkMetaData,_std::allocator<duckdb::ChunkMetaData>_>
                         );
      if (pCVar4 <= in_stack_ffffffffffffffa8._M_current) break;
      in_stack_ffffffffffffffa0 = in_RDI._M_current + 5;
      ::std::
      unique_ptr<duckdb::ColumnDataCollectionSegment,_std::default_delete<duckdb::ColumnDataCollectionSegment>_>
      ::get((unique_ptr<duckdb::ColumnDataCollectionSegment,_std::default_delete<duckdb::ColumnDataCollectionSegment>_>
             *)in_stack_ffffffffffffffa0);
      ::std::
      vector<duckdb::ColumnDataConsumer::ChunkReference,_std::allocator<duckdb::ColumnDataConsumer::ChunkReference>_>
      ::emplace_back<duckdb::ColumnDataCollectionSegment_*,_unsigned_long_&>
                ((vector<duckdb::ColumnDataConsumer::ChunkReference,_std::allocator<duckdb::ColumnDataConsumer::ChunkReference>_>
                  *)in_RDI._M_current,&(in_stack_ffffffffffffffa8._M_current)->segment,
                 (unsigned_long *)in_stack_ffffffffffffffa0);
      in_stack_ffffffffffffffa8._M_current = (ChunkReference *)((long)&pCVar5->segment + 1);
    }
    __gnu_cxx::
    __normal_iterator<const_duckdb::unique_ptr<duckdb::ColumnDataCollectionSegment,_std::default_delete<duckdb::ColumnDataCollectionSegment>,_true>_*,_std::vector<duckdb::unique_ptr<duckdb::ColumnDataCollectionSegment,_std::default_delete<duckdb::ColumnDataCollectionSegment>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnDataCollectionSegment,_std::default_delete<duckdb::ColumnDataCollectionSegment>,_true>_>_>_>
    ::operator++(&local_18);
  }
  ::std::
  vector<duckdb::ColumnDataConsumer::ChunkReference,_std::allocator<duckdb::ColumnDataConsumer::ChunkReference>_>
  ::begin(in_stack_ffffffffffffff98);
  ::std::
  vector<duckdb::ColumnDataConsumer::ChunkReference,_std::allocator<duckdb::ColumnDataConsumer::ChunkReference>_>
  ::end(in_stack_ffffffffffffff98);
  ::std::
  sort<__gnu_cxx::__normal_iterator<duckdb::ColumnDataConsumer::ChunkReference_*,_std::vector<duckdb::ColumnDataConsumer::ChunkReference,_std::allocator<duckdb::ColumnDataConsumer::ChunkReference>_>_>_>
            (in_RDI,in_stack_ffffffffffffffa8);
  return;
}

Assistant:

void ColumnDataConsumer::InitializeScan() {
	chunk_count = collection.ChunkCount();
	current_chunk_index = 0;
	chunk_delete_index = DConstants::INVALID_INDEX;

	// Initialize chunk references and sort them, so we can scan them in a sane order, regardless of how it was created
	chunk_references.reserve(chunk_count);
	for (auto &segment : collection.GetSegments()) {
		for (idx_t chunk_index = 0; chunk_index < segment->chunk_data.size(); chunk_index++) {
			chunk_references.emplace_back(segment.get(), chunk_index);
		}
	}
	std::sort(chunk_references.begin(), chunk_references.end());
}